

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O2

pair<pstore::index::details::index_pointer,_unsigned_long> __thiscall
pstore::index::details::internal_node::lookup(internal_node *this,hash_type hash_index)

{
  pair<pstore::index::details::index_pointer,_unsigned_long> pVar1;
  
  if (0x3f < hash_index) {
    assert_failed("hash_index < (hash_type{1} << hash_index_bits)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                  ,0x2d5);
  }
  if ((this->bitmap_ >> (hash_index & 0x3f) & 1) != 0) {
    pVar1.second = POPCOUNT(this->bitmap_ & (1L << ((byte)hash_index & 0x3f)) - 1U);
    pVar1.first.internal_ = this->children_[pVar1.second].internal_;
    return pVar1;
  }
  return (pair<pstore::index::details::index_pointer,_unsigned_long>)
         (ZEXT816(0xffffffffffffffff) << 0x40);
}

Assistant:

inline auto internal_node::lookup (hash_type const hash_index) const
                -> std::pair<index_pointer, std::size_t> {
                PSTORE_ASSERT (hash_index < (hash_type{1} << hash_index_bits));
                auto const bit_pos = hash_type{1} << hash_index;
                if ((bitmap_ & bit_pos) != 0) { //! OCLINT(PH - bitwise in conditional is ok)
                    std::size_t const index = bit_count::pop_count (bitmap_ & (bit_pos - 1U));
                    return {children_[index], index};
                }
                return {index_pointer{}, not_found};
            }